

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_EqualBinaryLogicalExpr_Test::TestBody(ExprTest_EqualBinaryLogicalExpr_Test *this)

{
  LogicalExpr lhs;
  LogicalExpr lhs_00;
  LogicalExpr lhs_01;
  LogicalExpr lhs_02;
  Expr e2;
  Expr e2_00;
  bool bVar1;
  char *in_RDI;
  AssertionResult *this_00;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined1 in_stack_fffffffffffffe9f;
  AssertionResult *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  uint uVar2;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 uVar3;
  ExprBase in_stack_fffffffffffffeb0;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int line;
  Type type;
  undefined4 uVar4;
  undefined4 uVar5;
  ExprBase in_stack_fffffffffffffed8;
  ExprBase e1;
  string local_118 [24];
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  AssertionResult *in_stack_ffffffffffffff18;
  AssertionResult *assertion_result;
  AssertHelper *in_stack_ffffffffffffff20;
  AssertHelper *this_02;
  AssertionResult local_a8;
  string local_98 [64];
  undefined8 local_58;
  undefined8 local_50;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_48;
  undefined8 local_38;
  undefined8 local_30;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_28;
  AssertionResult local_18;
  
  type = (Type)((ulong)(in_RDI + 0x10) >> 0x20);
  local_30 = *(undefined8 *)(in_RDI + 0x48);
  local_38 = *(undefined8 *)(in_RDI + 0x50);
  uVar4 = 0x32;
  lhs.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffebc;
  lhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffeb8;
  local_28.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (Kind)((ulong)in_stack_fffffffffffffea0 >> 0x20),lhs,
                  (LogicalExpr)in_stack_fffffffffffffeb0.impl_);
  uVar5 = 0;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffeb0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  local_50 = *(undefined8 *)(in_RDI + 0x48);
  local_58 = *(undefined8 *)(in_RDI + 0x50);
  lhs_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffebc;
  lhs_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffeb8;
  local_48.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (Kind)((ulong)in_stack_fffffffffffffea0 >> 0x20),lhs_00,
                  (LogicalExpr)in_stack_fffffffffffffeb0.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffeb0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  e2.super_ExprBase.impl_._4_4_ = uVar5;
  e2.super_ExprBase.impl_._0_4_ = uVar4;
  mp::Equal((Expr)in_stack_fffffffffffffed8.impl_,e2);
  e1.impl_ = (Impl *)&local_18;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)e1.impl_);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar5,uVar4));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar5,uVar4),type,in_RDI,in_stack_fffffffffffffebc,
               (char *)in_stack_fffffffffffffeb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_98);
    testing::Message::~Message((Message *)0x13a998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13aa13);
  this_00 = (AssertionResult *)(in_RDI + 0x10);
  uVar2 = 0x32;
  lhs_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffebc;
  lhs_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffeb8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
            ((BasicExprFactory<std::allocator<char>_> *)CONCAT44(in_stack_fffffffffffffeac,0x32),
             (Kind)((ulong)this_00 >> 0x20),lhs_01,(LogicalExpr)in_stack_fffffffffffffeb0.impl_);
  uVar3 = 0;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)(ulong)uVar2,
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffeb0.impl_,(type_conflict)((ulong)this_00 >> 0x20));
  this_02 = *(AssertHelper **)(in_RDI + 0x48);
  assertion_result = *(AssertionResult **)(in_RDI + 0x48);
  lhs_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffebc;
  lhs_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffeb8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
            ((BasicExprFactory<std::allocator<char>_> *)CONCAT44(uVar3,uVar2),
             (Kind)((ulong)this_00 >> 0x20),lhs_02,(LogicalExpr)in_stack_fffffffffffffeb0.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)CONCAT44(uVar3,uVar2),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffeb0.impl_,(type_conflict)((ulong)this_00 >> 0x20));
  e2_00.super_ExprBase.impl_._4_4_ = uVar5;
  e2_00.super_ExprBase.impl_._0_4_ = uVar4;
  mp::Equal((Expr)e1.impl_,e2_00);
  this_01 = &local_a8;
  testing::AssertionResult::AssertionResult(this_00,(bool)in_stack_fffffffffffffe9f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffebc);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar5,uVar4));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar5,uVar4),type,in_RDI,line,&this_01->success_);
    testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_118);
    testing::Message::~Message((Message *)0x13abdd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ac4c);
  return;
}

Assistant:

TEST_F(ExprTest, EqualBinaryLogicalExpr) {
  EXPECT_TRUE(Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1),
                    factory_.MakeBinaryLogical(expr::OR, l0, l1)));
  EXPECT_FALSE(Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1),
                     factory_.MakeBinaryLogical(expr::OR, l0, l0)));
}